

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ArrayColumnData::FetchRow
          (ArrayColumnData *this,TransactionData transaction,ColumnFetchState *state,row_t row_id,
          Vector *result,idx_t result_idx)

{
  LogicalType *type;
  idx_t iVar1;
  reference this_00;
  type pCVar2;
  ColumnSegment *pCVar3;
  LogicalType *type_00;
  idx_t capacity;
  ColumnScanState *__s;
  pointer this_01;
  pointer pCVar4;
  type pCVar5;
  Vector child_scan;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> local_c8;
  Vector *local_c0;
  idx_t local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  if ((state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_98._0_8_ = operator_new(0x50);
    *(long *)(local_98._0_8_ + 0x20) = 0;
    *(long *)(local_98._0_8_ + 0x28) = 0;
    *(long **)local_98._0_8_ = (long *)(local_98._0_8_ + 0x30);
    *(long *)(local_98._0_8_ + 8) = 1;
    *(long *)(local_98._0_8_ + 0x10) = 0;
    *(long *)(local_98._0_8_ + 0x18) = 0;
    *(undefined4 *)(local_98._0_8_ + 0x20) = 0x3f800000;
    *(long *)(local_98._0_8_ + 0x38) = 0;
    *(long *)(local_98._0_8_ + 0x40) = 0;
    *(long *)(local_98._0_8_ + 0x28) = 0;
    *(long *)(local_98._0_8_ + 0x30) = 0;
    *(long *)(local_98._0_8_ + 0x48) = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
                *)&state->child_states,
               (unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                *)&local_98);
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                 *)&local_98);
  }
  this_00 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
            ::operator[](&state->child_states,0);
  pCVar2 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
           ::operator*(this_00);
  pCVar3 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegment
                     (&(this->validity).super_ColumnData.data.
                       super_SegmentTree<duckdb::ColumnSegment,_false>,row_id);
  (*((pCVar3->function)._M_data)->fetch_row)
            (pCVar3,pCVar2,row_id - (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).start,result,
             result_idx);
  local_b8 = result_idx;
  ColumnData::FetchUpdateRow
            (&(this->validity).super_ColumnData,transaction,row_id,result,result_idx);
  local_c0 = ArrayVector::GetEntry(result);
  type = &(this->super_ColumnData).type;
  type_00 = ArrayType::GetChildType(type);
  capacity = ArrayType::GetSize(type);
  __s = (ColumnScanState *)operator_new(0x98);
  switchD_00569a20::default(__s,0,0x98);
  local_c8._M_head_impl = __s;
  this_01 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
            ::operator->((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                          *)&local_c8);
  ColumnScanState::Initialize(this_01,type_00,(optional_ptr<duckdb::TableScanOptions,_true>)0x0);
  iVar1 = (this->super_ColumnData).start;
  pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pCVar5 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>::
           operator*((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                      *)&local_c8);
  (*pCVar4->_vptr_ColumnData[8])(pCVar4,pCVar5,(row_id - iVar1) * capacity + iVar1);
  LogicalType::LogicalType(&local_b0,type_00);
  Vector::Vector(&local_98,&local_b0,capacity);
  iVar1 = local_b8;
  LogicalType::~LogicalType(&local_b0);
  pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pCVar5 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>::
           operator*((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                      *)&local_c8);
  (*pCVar4->_vptr_ColumnData[0xc])(pCVar4,pCVar5,&local_98,capacity,0);
  VectorOperations::Copy(&local_98,local_c0,capacity,0,capacity * iVar1);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)((long)&local_98 + 8));
  if (local_c8._M_head_impl != (ColumnScanState *)0x0) {
    ::std::default_delete<duckdb::ColumnScanState>::operator()
              ((default_delete<duckdb::ColumnScanState> *)&local_c8,local_c8._M_head_impl);
  }
  return;
}

Assistant:

void ArrayColumnData::FetchRow(TransactionData transaction, ColumnFetchState &state, row_t row_id, Vector &result,
                               idx_t result_idx) {

	// Create state for validity & child column
	if (state.child_states.empty()) {
		state.child_states.push_back(make_uniq<ColumnFetchState>());
	}

	// Fetch validity
	validity.FetchRow(transaction, *state.child_states[0], row_id, result, result_idx);

	// Fetch child column
	auto &child_vec = ArrayVector::GetEntry(result);
	auto &child_type = ArrayType::GetChildType(type);
	auto array_size = ArrayType::GetSize(type);

	// We need to fetch between [row_id * array_size, (row_id + 1) * array_size)
	auto child_state = make_uniq<ColumnScanState>();
	child_state->Initialize(child_type, nullptr);

	const auto child_offset = start + (UnsafeNumericCast<idx_t>(row_id) - start) * array_size;

	child_column->InitializeScanWithOffset(*child_state, child_offset);
	Vector child_scan(child_type, array_size);
	child_column->ScanCount(*child_state, child_scan, array_size);
	VectorOperations::Copy(child_scan, child_vec, array_size, 0, result_idx * array_size);
}